

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_mem.c
# Opt level: O1

void * aom_calloc(size_t num,size_t size)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  void *__s;
  size_t __n;
  
  if ((num != 0) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = num,
     SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1ffffffe9)) / auVar1,0) < size)) {
    return (void *)0x0;
  }
  __n = size * num;
  if ((__n < 0x1ffffffea) && (pvVar2 = malloc(__n + 0x17), pvVar2 != (void *)0x0)) {
    __s = (void *)((long)pvVar2 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)__s - 8) = pvVar2;
  }
  else {
    __s = (void *)0x0;
  }
  if (__s == (void *)0x0) {
    return (void *)0x0;
  }
  pvVar2 = memset(__s,0,__n);
  return pvVar2;
}

Assistant:

void *aom_calloc(size_t num, size_t size) {
  if (!check_size_argument_overflow(num, size, DEFAULT_ALIGNMENT)) return NULL;
  const size_t total_size = num * size;
  void *const x = aom_malloc(total_size);
  if (x) memset(x, 0, total_size);
  return x;
}